

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

int Cbs2_ManUpdateFrontier(Cbs2_Man_t *p,int iPropHeadOld,int *piDecLit)

{
  undefined8 uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  iVar3 = (p->pJust).iTail;
  *piDecLit = -1;
  if ((p->pProp).iHead != (p->pProp).iTail) {
    __assert_fail("Cbs2_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x4bb,"int Cbs2_ManUpdateFrontier(Cbs2_Man_t *, int, int *)");
  }
  iVar4 = (p->pJust).iHead;
  lVar9 = (long)iVar4;
  if (iVar4 < (p->pJust).iTail) {
    do {
      uVar7 = (p->pJust).pData[lVar9];
      if (((ulong)uVar7 == 0) || (iVar3 == lVar9)) break;
      if (((int)uVar7 < 0) || (p->pAig->nObjs <= (int)uVar7)) goto LAB_006e6b05;
      uVar1 = *(undefined8 *)(p->pAig->pObjs + uVar7);
      uVar8 = (uint)uVar1;
      if ((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) {
        uVar8 = uVar7 - (uVar8 & 0x1fffffff);
        if (((int)uVar8 < 0) || (iVar4 = (p->vAssign).nSize, iVar4 <= (int)uVar8))
        goto LAB_006e6b24;
        pcVar2 = (p->vAssign).pArray;
        if ('\x01' < pcVar2[uVar8]) {
          uVar8 = uVar7 - ((uint)((ulong)uVar1 >> 0x20) & 0x1fffffff);
          if (((int)uVar8 < 0) || (iVar4 <= (int)uVar8)) goto LAB_006e6b24;
          if ('\x01' < pcVar2[uVar8]) {
            iVar4 = (p->pJust).nSize;
            if ((p->pJust).iTail == iVar4) {
              (p->pJust).nSize = iVar4 * 2;
              piVar5 = (p->pJust).pData;
              local_38 = lVar6;
              if (piVar5 == (int *)0x0) {
                piVar5 = (int *)malloc((long)iVar4 << 3);
              }
              else {
                piVar5 = (int *)realloc(piVar5,(long)iVar4 << 3);
              }
              (p->pJust).pData = piVar5;
              lVar6 = local_38;
            }
            iVar4 = (p->pJust).iTail;
            (p->pJust).iTail = iVar4 + 1;
            (p->pJust).pData[iVar4] = uVar7;
          }
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->pJust).iTail);
  }
  (p->pProp).iHead = iPropHeadOld;
  iVar4 = (p->pProp).iTail;
  if (iPropHeadOld < iVar4) {
    lVar9 = (long)iPropHeadOld;
    uVar7 = (p->pProp).pData[lVar9];
    while (uVar7 != 0) {
      lVar9 = lVar9 + 1;
      if ((int)uVar7 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar7 = uVar7 >> 1;
      if (p->pAig->nObjs <= (int)uVar7) {
LAB_006e6b05:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar1 = *(undefined8 *)(p->pAig->pObjs + uVar7);
      uVar8 = (uint)uVar1;
      if ((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) {
        uVar8 = uVar7 - (uVar8 & 0x1fffffff);
        if (((int)uVar8 < 0) || (iVar4 = (p->vAssign).nSize, iVar4 <= (int)uVar8))
        goto LAB_006e6b24;
        pcVar2 = (p->vAssign).pArray;
        if ('\x01' < pcVar2[uVar8]) {
          uVar8 = uVar7 - ((uint)((ulong)uVar1 >> 0x20) & 0x1fffffff);
          if (((int)uVar8 < 0) || (iVar4 <= (int)uVar8)) {
LAB_006e6b24:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          if ('\x01' < pcVar2[uVar8]) {
            iVar4 = (p->pJust).nSize;
            if ((p->pJust).iTail == iVar4) {
              (p->pJust).nSize = iVar4 * 2;
              piVar5 = (p->pJust).pData;
              if (piVar5 == (int *)0x0) {
                piVar5 = (int *)malloc((long)iVar4 << 3);
              }
              else {
                piVar5 = (int *)realloc(piVar5,(long)iVar4 << 3);
              }
              (p->pJust).pData = piVar5;
            }
            iVar4 = (p->pJust).iTail;
            (p->pJust).iTail = iVar4 + 1;
            (p->pJust).pData[iVar4] = uVar7;
          }
        }
      }
      iVar4 = (p->pProp).iTail;
      if (iVar4 <= lVar9) break;
      uVar7 = (p->pProp).pData[lVar9];
    }
  }
  (p->pProp).iHead = iVar4;
  (p->pJust).iHead = iVar3;
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeJFront = p->timeJFront + lVar9 + lVar6;
  return (int)((p->pJust).iHead == (p->pJust).iTail);
}

Assistant:

int Cbs2_ManUpdateFrontier( Cbs2_Man_t * p, int iPropHeadOld, int * piDecLit )
{
    abctime clk = Abc_Clock();
    int i, iVar, iLit, iJustTailOld = p->pJust.iTail;
    *piDecLit = -1;
    assert( Cbs2_QueIsEmpty(&p->pProp) );
    // visit old frontier nodes
    Cbs2_QueForEachEntry( p->pJust, iVar, i )
        if ( i == iJustTailOld )
            break;
        else if ( Cbs2_VarIsJust(p, Gia_ManObj(p->pAig, iVar), iVar) )
        {
            Cbs2_QuePush( &p->pJust, iVar );
            //*piDecLit = Cbs2_ManUpdateDecVar( p, iVar, *piDecLit );
        }
    // append new nodes
    p->pProp.iHead = iPropHeadOld;
    Cbs2_QueForEachEntry( p->pProp, iLit, i )
    {
        iVar = Abc_Lit2Var(iLit);
        if ( Cbs2_VarIsJust(p, Gia_ManObj(p->pAig, iVar), iVar) )
        {
            Cbs2_QuePush( &p->pJust, iVar );
            //*piDecLit = Cbs2_ManUpdateDecVar( p, iVar, *piDecLit );
        }
    }
    p->pProp.iHead = p->pProp.iTail;
    // update the head of the frontier
    p->pJust.iHead = iJustTailOld;
    // return 1 if the queue is empty
    p->timeJFront += Abc_Clock() - clk;
//printf( "%d ", p->pJust.iTail - p->pJust.iHead );
    return Cbs2_QueIsEmpty(&p->pJust);
}